

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O1

Aig_Man_t * Inta_ManDeriveClauses(Inta_Man_t *pMan,Sto_Man_t *pCnf,int fClausesA)

{
  Sto_Cls_t *pSVar1;
  int iVar2;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *p0;
  ulong uVar4;
  uint i;
  Aig_Obj_t *p0_00;
  
  p = Aig_ManStart(10000);
  p0 = p->pConst1;
  for (pSVar1 = pCnf->pHead;
      (pSVar1 != (Sto_Cls_t *)0x0 && ((*(uint *)&pSVar1->field_0x1c & 2) != 0));
      pSVar1 = pSVar1->pNext) {
    if ((*(uint *)&pSVar1->field_0x1c & 1) == fClausesA) {
      p0_00 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
      if ((*(uint *)&pSVar1->field_0x1c & 0x7fffff8) != 0) {
        uVar4 = 0;
        do {
          iVar2 = *(int *)((long)&pSVar1[1].pNext + uVar4 * 4) >> 1;
          if (pMan->pVarTypes[iVar2] < 0) {
            i = ~pMan->pVarTypes[iVar2];
            if (pMan->vVarsAB->nSize <= (int)i) {
              __assert_fail("VarAB >= 0 && VarAB < Vec_IntSize(pMan->vVarsAB)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterA.c"
                            ,0x42f,
                            "Aig_Man_t *Inta_ManDeriveClauses(Inta_Man_t *, Sto_Man_t *, int)");
            }
          }
          else {
            i = iVar2 + pMan->vVarsAB->nSize + 1;
          }
          pAVar3 = Aig_IthVar(p,i);
          p0_00 = Aig_Or(p,p0_00,(Aig_Obj_t *)
                                 ((ulong)(*(uint *)((long)&pSVar1[1].pNext + uVar4 * 4) & 1) ^
                                 (ulong)pAVar3));
          uVar4 = uVar4 + 1;
        } while (uVar4 < (*(uint *)&pSVar1->field_0x1c >> 3 & 0xffffff));
      }
      p0 = Aig_And(p,p0,p0_00);
    }
  }
  Aig_ObjCreateCo(p,p0);
  return p;
}

Assistant:

Aig_Man_t * Inta_ManDeriveClauses( Inta_Man_t * pMan, Sto_Man_t * pCnf, int fClausesA )
{
    Aig_Man_t * p;
    Aig_Obj_t * pMiter, * pSum, * pLit;
    Sto_Cls_t * pClause;
    int Var, VarAB, v;
    p = Aig_ManStart( 10000 );
    pMiter = Aig_ManConst1(p);
    Sto_ManForEachClauseRoot( pCnf, pClause )
    {
        if ( fClausesA ^ pClause->fA ) // clause of B
            continue;
        // clause of A
        pSum = Aig_ManConst0(p);
        for ( v = 0; v < (int)pClause->nLits; v++ )
        {
            Var = lit_var(pClause->pLits[v]);
            if ( pMan->pVarTypes[Var] < 0 ) // global var
            {
                VarAB = -pMan->pVarTypes[Var]-1;
                assert( VarAB >= 0 && VarAB < Vec_IntSize(pMan->vVarsAB) );
                pLit = Aig_NotCond( Aig_IthVar(p, VarAB), lit_sign(pClause->pLits[v]) );
            }
            else
                pLit = Aig_NotCond( Aig_IthVar(p, Vec_IntSize(pMan->vVarsAB)+1+Var), lit_sign(pClause->pLits[v]) );
            pSum = Aig_Or( p, pSum, pLit );
        }
        pMiter = Aig_And( p, pMiter, pSum );
    }
    Aig_ObjCreateCo( p, pMiter );
    return p;
}